

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

Timestamp __thiscall Liby::operator-(Liby *this,Timestamp *lhs,Timestamp *rhs)

{
  time_t tVar1;
  time_t tVar2;
  suseconds_t sVar3;
  __suseconds_t extraout_RDX;
  Timestamp TVar4;
  suseconds_t rusec;
  suseconds_t lusec;
  time_t sec;
  Timestamp *rhs_local;
  Timestamp *lhs_local;
  
  tVar1 = Timestamp::sec(lhs);
  tVar2 = Timestamp::sec(rhs);
  lusec = tVar1 - tVar2;
  rusec = Timestamp::usec(lhs);
  sVar3 = Timestamp::usec(rhs);
  if (rusec < sVar3) {
    lusec = lusec + -1;
    rusec = rusec + 1000000;
  }
  Timestamp::Timestamp((Timestamp *)this,lusec,rusec - sVar3);
  TVar4.tv_.tv_usec = extraout_RDX;
  TVar4.tv_.tv_sec = (__time_t)this;
  return (Timestamp)TVar4.tv_;
}

Assistant:

inline Timestamp operator-(const Timestamp &lhs, const Timestamp &rhs) {
    auto sec = lhs.sec() - rhs.sec();
    auto lusec = lhs.usec();
    auto rusec = rhs.usec();

    if (lusec < rusec) {
        sec--;
        lusec += Timestamp::kMicrosecondsPerSecond;
    }
    lusec -= rusec;

    return Timestamp(sec, lusec);
}